

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercomm.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  SaveBlock save;
  LoadBlock load_;
  int iVar1;
  _Manager_type p_Var2;
  void *b;
  Link *pLVar3;
  ConsumerBlock *this;
  ulong uVar4;
  _Any_data *this_00;
  _Invoker_type in_stack_ffffffffffffe778;
  undefined8 uStack_1880;
  environment env;
  _Any_data local_1878;
  _Invoker_type local_1868;
  QueuePolicy *in_stack_ffffffffffffe7a0;
  communicator world;
  MPI_Comm intercomm;
  communicator local;
  communicator local_1820;
  _Any_data local_1808;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  _Any_data local_17e8;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  _Any_data local_17c8;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  _Any_data local_17a8;
  undefined8 local_1798;
  undefined8 uStack_1790;
  MemoryManagement local_1788;
  _Any_data local_1728;
  code *local_1718;
  code *local_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  code *local_16f8;
  code *local_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  code *local_16d8;
  code *local_16d0;
  _Any_data local_16c8;
  code *local_16b8;
  code *local_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  code *local_1698;
  code *local_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  code *local_1678;
  code *local_1670;
  Master master;
  
  diy::mpi::environment::environment(&env,argc,argv);
  diy::mpi::communicator::communicator(&world);
  srand(world.rank_);
  iVar1 = world.size_ / 2;
  uVar4 = 0;
  diy::mpi::communicator::split(&local,&world,(uint)(world.rank_ < iVar1),0);
  if (world.rank_ < iVar1) {
    uVar4 = (long)world.size_ / 2 & 0xffffffff;
  }
  MPI_Intercomm_create(local.comm_.data,0,world.comm_.data,uVar4,0,&intercomm);
  diy::mpi::communicator::communicator(&local_1820,intercomm);
  local_1798 = 0;
  uStack_1790 = 0;
  local_17a8._M_unused._M_object = (void *)0x0;
  local_17a8._8_8_ = 0;
  local_17c8._M_unused._M_object = (void *)0x0;
  local_17c8._8_8_ = 0;
  local_17b8 = 0;
  uStack_17b0 = 0;
  local_17e8._M_unused._M_object = (void *)0x0;
  local_17e8._8_8_ = 0;
  local_17d8 = 0;
  uStack_17d0 = 0;
  local_1808._M_unused._M_object = (void *)0x0;
  local_1808._8_8_ = 0;
  local_17f8 = 0;
  uStack_17f0 = 0;
  p_Var2 = (_Manager_type)operator_new(0x10);
  *(undefined ***)p_Var2 = &PTR_unload_incoming_0013e540;
  *(undefined8 *)(p_Var2 + 8) = 0x1000;
  save.super__Function_base._M_functor._8_8_ = &local_1808;
  save.super__Function_base._M_functor._M_unused._M_object = &local_17e8;
  save.super__Function_base._M_manager = p_Var2;
  save._M_invoker = in_stack_ffffffffffffe778;
  load_.super__Function_base._M_functor._8_8_ = local_1878._M_unused._0_8_;
  load_.super__Function_base._M_functor._M_unused._M_object = (void *)uStack_1880;
  load_.super__Function_base._M_manager = (_Manager_type)local_1878._8_8_;
  load_._M_invoker = local_1868;
  diy::Master::Master(&master,&local_1820,1,-1,(CreateBlock *)&local_17a8,
                      (DestroyBlock *)&local_17c8,(ExternalStorage *)0x0,save,load_,
                      in_stack_ffffffffffffe7a0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1808);
  std::_Function_base::~_Function_base((_Function_base *)&local_17e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_17c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_17a8);
  diy::mpi::communicator::~communicator(&local_1820);
  local_1878._M_unused._M_object = &local;
  if (world.rank_ < iVar1) {
    b = operator_new(1);
    pLVar3 = (Link *)operator_new(0x20);
    (pLVar3->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__0013e710;
    (pLVar3->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pLVar3->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pLVar3->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    diy::Master::add(&master,local.rank_,b,pLVar3);
    this_00 = &local_16c8;
    local_16c8._M_unused._M_object = (void *)0x0;
    local_16c8._8_8_ = 0;
    local_16b0 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_invoke;
    local_16b8 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
    local_16a8 = 0;
    uStack_16a0 = 0;
    local_1690 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_invoke;
    local_1698 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
    local_1688 = 0;
    uStack_1680 = 0;
    local_1670 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_invoke;
    local_1678 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
    local_1878._8_8_ = 0;
    local_1868 = std::
                 _Function_handler<bool_(ProducerBlock_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/simple/intercomm.cpp:44:26)>
                 ::_M_manager;
    diy::MemoryManagement::MemoryManagement(&local_1788,(MemoryManagement *)this_00);
    diy::Master::iexchange_<ProducerBlock>
              (&master,(ICallback<ProducerBlock> *)&local_1878,&local_1788);
  }
  else {
    this = (ConsumerBlock *)operator_new(0x20);
    ConsumerBlock::ConsumerBlock(this,world.size_ / 2);
    pLVar3 = (Link *)operator_new(0x20);
    (pLVar3->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__0013e710;
    (pLVar3->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pLVar3->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pLVar3->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    diy::Master::add(&master,local.rank_,this,pLVar3);
    this_00 = &local_1728;
    local_1728._M_unused._M_object = (void *)0x0;
    local_1728._8_8_ = 0;
    local_1710 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_invoke;
    local_1718 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
    local_1708 = 0;
    uStack_1700 = 0;
    local_16f0 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_invoke;
    local_16f8 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
    local_16e8 = 0;
    uStack_16e0 = 0;
    local_16d0 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_invoke;
    local_16d8 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
    local_1878._8_8_ = 0;
    local_1868 = std::
                 _Function_handler<bool_(ConsumerBlock_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/simple/intercomm.cpp:68:26)>
                 ::_M_manager;
    diy::MemoryManagement::MemoryManagement(&local_1788,(MemoryManagement *)this_00);
    diy::Master::iexchange_<ConsumerBlock>
              (&master,(ICallback<ConsumerBlock> *)&local_1878,&local_1788);
  }
  diy::MemoryManagement::~MemoryManagement(&local_1788);
  std::_Function_base::~_Function_base((_Function_base *)&local_1878);
  diy::MemoryManagement::~MemoryManagement((MemoryManagement *)this_00);
  diy::Master::~Master(&master);
  diy::mpi::communicator::~communicator(&local);
  diy::mpi::communicator::~communicator(&world);
  diy::mpi::environment::~environment(&env);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment   env(argc, argv); // equivalent of MPI_Init(argc, argv)/MPI_Finalize()
    diy::mpi::communicator  world;           // equivalent of MPI_COMM_WORLD

    srand(world.rank());

    bool producer = world.rank() < world.size() / 2;
    diy::mpi::communicator  local = world.split(producer);

    MPI_Comm intercomm;
    MPI_Intercomm_create(local, 0, world, /* remote_leader = */ producer ? world.size() / 2 : 0, /* tag = */ 0, &intercomm);

    diy::Master master(intercomm);
    if (producer)
    {
        master.add(local.rank(), new ProducerBlock, new diy::Link);

        // respond to queries
        master.iexchange([&local](ProducerBlock*, const diy::Master::ProxyWithLink& cp) -> bool
        {
            for (auto& x : *cp.incoming())
            {
                int   gid   = x.first;
                auto& queue = x.second;
                while (queue)
                {
                    int query;
                    diy::load(queue, query);

                    int response = query * local.rank();
                    cp.enqueue(diy::BlockID { gid, gid }, response);

                    fmt::print("[{} producer] received {} from {}; responded {}\n", local.rank(), query, gid, response);
                }
            }

            return true;       // done; producer never has any local work
        });
    } else
    {
        master.add(local.rank(), new ConsumerBlock(world.size()/2), new diy::Link);

        master.iexchange([&local](ConsumerBlock* b, const diy::Master::ProxyWithLink& cp) -> bool
        {
            // schedule 5 queries at a time
            for (int i = 0; i < 5 && b->cur < b->queries.size(); ++i, ++b->cur)
            {
                int target = b->queries[b->cur].first;
                int query  = b->queries[b->cur].second;
                cp.enqueue(diy::BlockID { target, target }, query);

                fmt::print("[{} consumer] Enqueueing {} to {}\n", local.rank(), query, target);
            }

            for (auto& x : *cp.incoming())
            {
                int   gid   = x.first;
                auto& queue = x.second;
                while (queue)
                {
                    int response;
                    diy::load(queue, response);
                    fmt::print("[{} consumer] Received {} from {}\n", local.rank(), response, gid);
                }
            }

            return b->cur == b->queries.size();
        });
    }
}